

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_bitmap_rank(roaring64_bitmap_t *r,uint64_t val)

{
  int iVar1;
  int compare_result;
  leaf_t *leaf;
  uint64_t rank;
  art_iterator_t it;
  uint16_t low16;
  uint8_t high48 [6];
  art_key_chunk_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 first;
  art_t *in_stack_ffffffffffffff50;
  container_t *c;
  long local_a0;
  
  first = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  split_key(CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38)
  ;
  art_init_iterator(in_stack_ffffffffffffff50,(_Bool)first);
  c = (container_t *)0x0;
  while( true ) {
    if (local_a0 == 0) {
      return (uint64_t)c;
    }
    in_stack_ffffffffffffff44 =
         compare_high48((art_key_chunk_t *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
    if (-1 < in_stack_ffffffffffffff44) break;
    iVar1 = container_get_cardinality(in_stack_ffffffffffffff38,'\0');
    c = (container_t *)((long)iVar1 + (long)c);
    art_iterator_next((art_iterator_t *)0x105ccc);
  }
  if (in_stack_ffffffffffffff44 != 0) {
    return (uint64_t)c;
  }
  iVar1 = container_rank(c,'\0',0);
  return (long)c + (long)iVar1;
}

Assistant:

uint64_t roaring64_bitmap_rank(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t rank = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            rank += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            return rank +
                   container_rank(leaf->container, leaf->typecode, low16);
        } else {
            return rank;
        }
        art_iterator_next(&it);
    }
    return rank;
}